

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O1

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::InstanceKinematicsScene>::~PointerArray
          (PointerArray<COLLADAFW::InstanceKinematicsScene> *this)

{
  ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*> *pAVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->_vptr_PointerArray = (_func_int **)&PTR__PointerArray_009e1c60;
  pAVar1 = &this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>;
  sVar2 = (this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>).mCount;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      if (pAVar1->mData[sVar3] != (InstanceKinematicsScene *)0x0) {
        (*(pAVar1->mData[sVar3]->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
          super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.super_Object._vptr_Object[1])
                  ();
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  if (((this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>).mFlags & 1) != 0) {
    free(pAVar1->mData);
    pAVar1->mData = (InstanceKinematicsScene **)0x0;
    (this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>).mCount = 0;
    (this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>).mCapacity = 0;
  }
  return;
}

Assistant:

virtual ~PointerArray()
		{
			deleteContents();
		}